

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

ggml_tensor * __thiscall
llm_graph_context::build_inp_embd(llm_graph_context *this,ggml_tensor *tok_embd)

{
  float fVar1;
  uint32_t uVar2;
  llama_ubatch *plVar3;
  ggml_tensor *pgVar4;
  ggml_context *pgVar5;
  tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_> tVar6;
  long lVar7;
  ggml_tensor *__args_1;
  llama_adapter_lora_weight *plVar8;
  undefined8 uVar9;
  _Hash_node_base *p_Var10;
  long *plVar11;
  float fVar12;
  __uniq_ptr_impl<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_38;
  
  uVar2 = this->hparams->n_embd;
  tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
  super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       operator_new(0x18);
  *(undefined ***)
   tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
   super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl = &PTR__llm_graph_input_i_00285d70
  ;
  *(long *)((long)tVar6.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar6.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x10) = 0;
  plVar3 = this->ubatch;
  if (plVar3->token == (llama_token *)0x0) {
    lVar7 = ggml_new_tensor_2d(this->ctx0,0,uVar2,plVar3->n_tokens);
    *(long *)((long)tVar6.
                    super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                    .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x10) = lVar7;
    ggml_set_input(lVar7);
    __args_1 = *(ggml_tensor **)
                ((long)tVar6.
                       super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                       .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x10);
  }
  else {
    lVar7 = ggml_new_tensor_1d(this->ctx0,0x1a,plVar3->n_tokens);
    plVar11 = (long *)((long)tVar6.
                             super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                             .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8);
    *plVar11 = lVar7;
    ggml_set_input(lVar7);
    __args_1 = (ggml_tensor *)ggml_get_rows(this->ctx0,tok_embd,*plVar11);
    for (p_Var10 = (this->loras->_M_h)._M_before_begin._M_nxt; p_Var10 != (_Hash_node_base *)0x0;
        p_Var10 = p_Var10->_M_nxt) {
      plVar8 = llama_adapter_lora::get_weight((llama_adapter_lora *)p_Var10[1]._M_nxt,tok_embd);
      if (plVar8 != (llama_adapter_lora_weight *)0x0) {
        fVar12 = *(float *)&p_Var10[2]._M_nxt;
        fVar1 = *(float *)&p_Var10[1]._M_nxt[0xd]._M_nxt;
        pgVar4 = plVar8->b;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          fVar12 = (fVar12 * fVar1) / (float)pgVar4->ne[0];
        }
        pgVar5 = this->ctx0;
        uVar9 = ggml_get_rows(pgVar5,plVar8->a,*plVar11);
        uVar9 = ggml_mul_mat(pgVar5,pgVar4,uVar9);
        uVar9 = ggml_scale(fVar12,pgVar5,uVar9);
        __args_1 = (ggml_tensor *)ggml_add(this->ctx0,__args_1,uVar9);
      }
    }
  }
  fVar12 = this->hparams->f_embedding_scale;
  if ((fVar12 != 0.0) || (NAN(fVar12))) {
    __args_1 = (ggml_tensor *)ggml_scale(this->ctx0,__args_1);
  }
  if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
              (this->cb_func,this->ubatch,__args_1,"inp_embd",-1);
  }
  local_38._M_t.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
       super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>,std::allocator<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>>
  ::emplace_back<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>
            ((vector<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>,std::allocator<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>>
              *)&((this->res)._M_t.
                  super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>
                  .super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->inputs,
             (unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)&local_38);
  if ((_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
      super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl != (llm_graph_input_i *)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8))();
  }
  return __args_1;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_embd(ggml_tensor * tok_embd) const {
    const int64_t n_embd = hparams.n_embd;

    auto inp = std::make_unique<llm_graph_input_embd>();

    ggml_tensor * cur = nullptr;

    if (ubatch.token) {
        inp->tokens = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ubatch.n_tokens);
        //cb(inp->tokens, "inp_tokens", -1);
        ggml_set_input(inp->tokens);

        cur = ggml_get_rows(ctx0, tok_embd, inp->tokens);

        // apply lora for embedding tokens if needed
        for (const auto & lora : *loras) {
            llama_adapter_lora_weight * lw = lora.first->get_weight(tok_embd);
            if (lw == nullptr) {
                continue;
            }

            const float adapter_scale = lora.second;
            const float scale = lw->get_scale(lora.first->alpha, adapter_scale);

            ggml_tensor * inpL_delta = ggml_scale(ctx0, ggml_mul_mat(
                        ctx0, lw->b, // non-transposed lora_b
                        ggml_get_rows(ctx0, lw->a, inp->tokens)
                        ), scale);

            cur = ggml_add(ctx0, cur, inpL_delta);
        }
    } else {
        inp->embd = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_embd, ubatch.n_tokens);
        ggml_set_input(inp->embd);

        cur = inp->embd;
    }

    // For Granite architecture
    if (hparams.f_embedding_scale != 0.0f) {
        cur = ggml_scale(ctx0, cur, hparams.f_embedding_scale);
    }

    cb(cur, "inp_embd", -1);

    res->add_input(std::move(inp));

    return cur;
}